

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindCommon.cxx
# Opt level: O3

void __thiscall cmFindCommon::~cmFindCommon(cmFindCommon *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  (this->super_cmCommand)._vptr_cmCommand = (_func_int **)&PTR__cmFindCommon_005fc360;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&(this->SearchPathsEmitted)._M_t);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->SearchPaths);
  std::
  _Rb_tree<cmFindCommon::PathLabel,_std::pair<const_cmFindCommon::PathLabel,_cmSearchPath>,_std::_Select1st<std::pair<const_cmFindCommon::PathLabel,_cmSearchPath>_>,_std::less<cmFindCommon::PathLabel>,_std::allocator<std::pair<const_cmFindCommon::PathLabel,_cmSearchPath>_>_>
  ::~_Rb_tree(&(this->LabeledPaths)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFindCommon::PathLabel>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFindCommon::PathLabel>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFindCommon::PathLabel>_>_>
  ::~_Rb_tree(&(this->PathLabelStringMap)._M_t);
  std::vector<cmFindCommon::PathGroup,_std::allocator<cmFindCommon::PathGroup>_>::~vector
            (&this->PathGroupOrder);
  std::
  _Rb_tree<cmFindCommon::PathGroup,_std::pair<const_cmFindCommon::PathGroup,_std::vector<cmFindCommon::PathLabel,_std::allocator<cmFindCommon::PathLabel>_>_>,_std::_Select1st<std::pair<const_cmFindCommon::PathGroup,_std::vector<cmFindCommon::PathLabel,_std::allocator<cmFindCommon::PathLabel>_>_>_>,_std::less<cmFindCommon::PathGroup>,_std::allocator<std::pair<const_cmFindCommon::PathGroup,_std::vector<cmFindCommon::PathLabel,_std::allocator<cmFindCommon::PathLabel>_>_>_>_>
  ::~_Rb_tree(&(this->PathGroupLabelMap)._M_t);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->SearchPathSuffixes);
  pcVar1 = (this->CMakePathName)._M_dataplus._M_p;
  paVar2 = &(this->CMakePathName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->UserGuessArgs);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->UserHintsArgs);
  (this->super_cmCommand)._vptr_cmCommand = (_func_int **)&PTR__cmCommand_005f6f50;
  pcVar1 = (this->super_cmCommand).Error._M_dataplus._M_p;
  paVar2 = &(this->super_cmCommand).Error.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

cmFindCommon::~cmFindCommon() = default;